

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

UnknownFieldSet * google::protobuf::UnknownFieldSet::default_instance(void)

{
  int iVar1;
  UnknownFieldSet *arg;
  
  if (default_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&default_instance()::instance);
    if (iVar1 != 0) {
      arg = (UnknownFieldSet *)operator_new(0x18);
      (arg->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (arg->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (arg->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::UnknownFieldSet>::
                 anon_class_1_0_00000001::__invoke,arg);
      default_instance::instance = arg;
      __cxa_guard_release(&default_instance()::instance);
    }
  }
  return default_instance::instance;
}

Assistant:

const UnknownFieldSet* UnknownFieldSet::default_instance() {
  static auto instance = internal::OnShutdownDelete(new UnknownFieldSet());
  return instance;
}